

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O3

bool __thiscall
YAML::EmitterState::SetBoolCaseFormat(EmitterState *this,EMITTER_MANIP value,value scope)

{
  if (value - UpperCase < 3) {
    _Set<YAML::EMITTER_MANIP>(this,&this->m_boolCaseFmt,value,scope);
  }
  return value - UpperCase < 3;
}

Assistant:

bool EmitterState::SetBoolCaseFormat(EMITTER_MANIP value,
                                     FmtScope::value scope) {
  switch (value) {
    case UpperCase:
    case LowerCase:
    case CamelCase:
      _Set(m_boolCaseFmt, value, scope);
      return true;
    default:
      return false;
  }
}